

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getRows(Highs *this,HighsInt num_set_entries,HighsInt *set,HighsInt *num_row,double *lower,
              double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  HighsInt HVar1;
  undefined4 *in_RCX;
  int in_ESI;
  HighsLogOptions *in_RDI;
  undefined4 *in_stack_00000008;
  HighsLogOptions *in_stack_00000018;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  HighsLogOptions *in_stack_fffffffffffffe98;
  HighsLogOptions *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  allocator *paVar2;
  undefined1 *puVar3;
  undefined4 in_stack_fffffffffffffec8;
  allocator local_121;
  HighsInt in_stack_fffffffffffffee0;
  HighsInt in_stack_fffffffffffffee4;
  HighsInt *in_stack_fffffffffffffee8;
  HighsInt in_stack_fffffffffffffef4;
  HighsIndexCollection *in_stack_fffffffffffffef8;
  HighsInt *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  HighsInt *in_stack_ffffffffffffff20;
  HighsIndexCollection *in_stack_ffffffffffffff28;
  Highs *in_stack_ffffffffffffff30;
  HighsInt *in_stack_ffffffffffffff60;
  HighsInt *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  undefined1 local_88 [132];
  HighsStatus local_4;
  
  if (in_ESI == 0) {
    *in_RCX = 0;
    *in_stack_00000008 = 0;
    local_4 = kOk;
  }
  else {
    puVar3 = local_88;
    HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffea0);
    HVar1 = create(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee4);
    if (HVar1 == 0) {
      getRowsInterface(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20
                       ,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68
                       ,(double *)(ulong)in_stack_ffffffffffffff70);
      local_4 = kOk;
      in_stack_fffffffffffffea0 = in_stack_00000018;
    }
    else {
      HighsLogOptions::HighsLogOptions(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      paVar2 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,"getRows",paVar2);
      local_4 = analyseSetCreateError
                          (in_RDI,(string *)CONCAT44(HVar1,in_stack_fffffffffffffec8),
                           (HighsInt)((ulong)puVar3 >> 0x20),SUB81((ulong)puVar3 >> 0x18,0),
                           (HighsInt)((ulong)paVar2 >> 0x20),
                           (HighsInt *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                           ,in_stack_fffffffffffffee0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x496a34);
    }
    HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffea0);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getRows(const HighsInt num_set_entries, const HighsInt* set,
                           HighsInt& num_row, double* lower, double* upper,
                           HighsInt& num_nz, HighsInt* start, HighsInt* index,
                           double* value) const {
  if (num_set_entries == 0) {
    num_row = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "getRows", create_error,
                                 false, num_set_entries, set,
                                 model_.lp_.num_row_);
  getRowsInterface(index_collection, num_row, lower, upper, num_nz, start,
                   index, value);
  return HighsStatus::kOk;
}